

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

Gia_Man_t *
Gia_ManCorrSpecReduceInit
          (Gia_Man_t *p,int nFrames,int nPrefix,int fScorr,Vec_Int_t **pvOutputs,int fRings)

{
  Vec_Int_t *pVVar1;
  int iLit;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int local_68;
  
  if (nFrames < 2 || fScorr != 0) {
    if ((nPrefix == 0) && (nFrames < 1 || fScorr == 0)) {
      __assert_fail("(!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                    ,0xe5,
                    "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                   );
    }
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                  ,0xe6,
                  "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
                 );
  }
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    iVar7 = nFrames + nPrefix;
    iVar6 = fScorr + iVar7;
    Vec_IntFill(&p->vCopies,p->nObjs * iVar6,nFrames);
    Gia_ManSetPhase(p);
    p_00 = Gia_ManStart(p->nObjs * iVar7);
    pcVar2 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar2;
    pcVar2 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar2;
    Gia_ManHashAlloc(p_00);
    iVar8 = 0;
    while ((iVar8 < p->nRegs &&
           (pGVar3 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar8), pGVar3 != (Gia_Obj_t *)0x0)))
    {
      Gia_ManAppendCi(p_00);
      Gia_ObjSetCopyF(p,0,pGVar3,0);
      iVar8 = iVar8 + 1;
    }
    iVar8 = 0;
    if (iVar6 < 1) {
      iVar6 = iVar8;
    }
    for (; iVar8 != iVar6; iVar8 = iVar8 + 1) {
      iVar9 = 0;
      Gia_ObjSetCopyF(p,iVar8,p->pObjs,0);
      while ((iVar9 < p->vCis->nSize - p->nRegs &&
             (pGVar3 = Gia_ManCi(p,iVar9), pGVar3 != (Gia_Obj_t *)0x0))) {
        iLit = Gia_ManAppendCi(p_00);
        Gia_ObjSetCopyF(p,iVar8,pGVar3,iLit);
        iVar9 = iVar9 + 1;
      }
    }
    pVVar4 = Vec_IntAlloc(1000);
    *pvOutputs = pVVar4;
    pVVar4 = Vec_IntAlloc(1000);
    for (iVar6 = nPrefix; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      lVar10 = 1;
      while ((lVar10 < p->nObjs && (pGVar3 = Gia_ManObj(p,(int)lVar10), pGVar3 != (Gia_Obj_t *)0x0))
            ) {
        iVar8 = Gia_ObjId(p,pGVar3);
        pObj = Gia_ObjReprObj(p,iVar8);
        if (pObj != (Gia_Obj_t *)0x0) {
          if (((uint)p->pReprs[lVar10] & 0xfffffff) == 0) {
            local_68 = 0;
          }
          else {
            local_68 = Gia_ManCorrSpecReal(p_00,p,pObj,iVar6,nPrefix);
          }
          iVar8 = Gia_ManCorrSpecReal(p_00,p,pGVar3,iVar6,nPrefix);
          iVar8 = Abc_LitNotCond(iVar8,((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) ^
                                       (uint)((ulong)*(undefined8 *)pObj >> 0x20)) >> 0x1f);
          if (local_68 != iVar8) {
            pVVar1 = *pvOutputs;
            iVar9 = Gia_ObjId(p,pObj);
            Vec_IntPush(pVVar1,iVar9);
            pVVar1 = *pvOutputs;
            iVar9 = Gia_ObjId(p,pGVar3);
            Vec_IntPush(pVVar1,iVar9);
            iVar8 = Gia_ManHashXor(p_00,local_68,iVar8);
            Vec_IntPush(pVVar4,iVar8);
          }
        }
        lVar10 = lVar10 + 1;
      }
    }
    iVar6 = pVVar4->nSize;
    iVar7 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
      iVar7 = 0;
    }
    for (; iVar6 != iVar7; iVar7 = iVar7 + 1) {
      iVar8 = Vec_IntEntry(pVVar4,iVar7);
      Gia_ManAppendCo(p_00,iVar8);
    }
    Vec_IntFree(pVVar4);
    Gia_ManHashStop(p_00);
    Vec_IntErase(&p->vCopies);
    pGVar5 = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
    return pGVar5;
  }
  __assert_fail("p->pReprs != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                ,0xe7,
                "Gia_Man_t *Gia_ManCorrSpecReduceInit(Gia_Man_t *, int, int, int, Vec_Int_t **, int)"
               );
}

Assistant:

Gia_Man_t * Gia_ManCorrSpecReduceInit( Gia_Man_t * p, int nFrames, int nPrefix, int fScorr, Vec_Int_t ** pvOutputs, int fRings )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    Vec_Int_t * vXorLits;
    int f, i, iPrevNew, iObjNew;
    assert( (!fScorr && nFrames > 1) || (fScorr && nFrames > 0) || nPrefix );
    assert( Gia_ManRegNum(p) > 0 );
    assert( p->pReprs != NULL );
    Vec_IntFill( &p->vCopies, (nFrames+nPrefix+fScorr)*Gia_ManObjNum(p), -1 );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( (nFrames+nPrefix) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_ManAppendCi(pNew);
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    }
    for ( f = 0; f < nFrames+nPrefix+fScorr; f++ )
    { 
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
    }
    *pvOutputs = Vec_IntAlloc( 1000 );
    vXorLits = Vec_IntAlloc( 1000 );
    for ( f = nPrefix; f < nFrames+nPrefix; f++ )
    {
        Gia_ManForEachObj1( p, pObj, i )
        {
            pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
            if ( pRepr == NULL )
                continue;
            iPrevNew = Gia_ObjIsConst(p, i)? 0 : Gia_ManCorrSpecReal( pNew, p, pRepr, f, nPrefix );
            iObjNew  = Gia_ManCorrSpecReal( pNew, p, pObj, f, nPrefix );
            iObjNew  = Abc_LitNotCond( iObjNew, Gia_ObjPhase(pRepr) ^ Gia_ObjPhase(pObj) );
            if ( iPrevNew != iObjNew )
            {
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pRepr) );
                Vec_IntPush( *pvOutputs, Gia_ObjId(p, pObj) );
                Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, iPrevNew, iObjNew) );
            }
        }
    }
    Vec_IntForEachEntry( vXorLits, iObjNew, i )
        Gia_ManAppendCo( pNew, iObjNew );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    Vec_IntErase( &p->vCopies );
//Abc_Print( 1, "Before sweeping = %d\n", Gia_ManAndNum(pNew) );
    pNew = Gia_ManCleanup( pTemp = pNew );
//Abc_Print( 1, "After sweeping = %d\n", Gia_ManAndNum(pNew) );
    Gia_ManStop( pTemp );
    return pNew;
}